

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O0

int __thiscall leveldb::Slice::compare(Slice *this,Slice *b)

{
  size_t local_38;
  int local_24;
  int r;
  size_t min_len;
  Slice *b_local;
  Slice *this_local;
  
  if (this->size_ < b->size_) {
    local_38 = this->size_;
  }
  else {
    local_38 = b->size_;
  }
  local_24 = memcmp(this->data_,b->data_,local_38);
  if (local_24 == 0) {
    if (this->size_ < b->size_) {
      local_24 = -1;
    }
    else if (b->size_ < this->size_) {
      local_24 = 1;
    }
  }
  return local_24;
}

Assistant:

inline int Slice::compare(const Slice &b) const {
        const size_t min_len = (size_ < b.size_) ? size_ : b.size_;
        int r = memcmp(data_, b.data_, min_len);
        if (r == 0) {
            if (size_ < b.size_) r = -1;
            else if (size_ > b.size_) r = +1;
        }
        return r;
    }